

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

bool __thiscall LiteScript::Character::operator==(Character *this,String *str)

{
  int iVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  
  String::String((String *)&local_30,(this->str->str)._M_dataplus._M_p[this->i]);
  iVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                    (&local_30,&str->str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return iVar1 == 0;
}

Assistant:

bool LiteScript::Character::operator==(const LiteScript::String& str) const {
    return (String(this->str[i]) == str);
}